

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       *this,BinaryReader<mp::internal::EndiannessConverter> *bound_reader)

{
  byte bVar1;
  NLHeader *pNVar2;
  byte *pbVar3;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  BinaryReader<mp::internal::EndiannessConverter> *pBVar8;
  Type type;
  uint info;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined8 in_RAX;
  LogicalExpr LVar12;
  LinearExprHandler linear_expr;
  NumericExpr NVar13;
  BinaryReader<mp::internal::EndiannessConverter> *pBVar14;
  StringRef name;
  BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_> local_68;
  uint local_4c;
  ArgList local_48;
  BinaryReader<mp::internal::EndiannessConverter> *local_38;
  
  local_4c = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),
                            bound_reader == (BinaryReader<mp::internal::EndiannessConverter> *)0x0);
  pNVar2 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  local_38 = bound_reader;
  do {
    while( true ) {
      pBVar8 = local_38;
      pBVar14 = this->reader_;
      pbVar3 = (byte *)(pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.token_ = (char *)pbVar3;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_ = (char *)(pbVar3 + 1);
      bVar1 = *pbVar3;
      if (bVar1 < 0x62) break;
      if (bVar1 < 0x6b) {
        if (bVar1 == 0x62) {
          if ((local_4c & 1) == 0) {
            if (local_38 == (BinaryReader<mp::internal::EndiannessConverter> *)0x0) {
              local_68.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
              local_68.index_ = 0;
              local_68._12_4_ = 0;
              local_48.types_ = 0;
              local_48.field_1.values_ = (Value *)&local_68;
              BinaryReaderBase::ReportError
                        (&pBVar14->super_BinaryReaderBase,(CStringRef)0x4b9747,&local_48);
              pBVar14 = this->reader_;
            }
            pcVar5 = (pBVar8->super_BinaryReaderBase).super_ReaderBase.ptr_;
            pcVar6 = (pBVar8->super_BinaryReaderBase).super_ReaderBase.start_;
            pcVar7 = (pBVar8->super_BinaryReaderBase).super_ReaderBase.token_;
            (pBVar14->super_BinaryReaderBase).super_ReaderBase.end_ =
                 (pBVar8->super_BinaryReaderBase).super_ReaderBase.end_;
            (pBVar14->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar7;
            (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5;
            (pBVar14->super_BinaryReaderBase).super_ReaderBase.start_ = pcVar6;
            std::__cxx11::string::_M_assign
                      ((string *)&(pBVar14->super_BinaryReaderBase).super_ReaderBase.name_);
            local_38 = (BinaryReader<mp::internal::EndiannessConverter> *)0x0;
          }
          else {
            NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
            ::
            ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                      ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                        *)this);
            local_4c = 0;
            if ((this->flags_ & 1) != 0) {
              return;
            }
          }
        }
        else {
          if (bVar1 != 100) goto switchD_0045d47c_caseD_44;
          NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
          ::
          ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                    ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                      *)this);
        }
      }
      else if (bVar1 == 0x6b) {
        ReadColumnSizes<true>(this);
      }
      else if (bVar1 == 0x72) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this);
      }
      else {
        if (bVar1 != 0x78) goto switchD_0045d47c_caseD_44;
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this);
      }
    }
    switch(bVar1) {
    case 0x43:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.
                            num_algebraic_cons);
      pBVar14 = this->reader_;
      pNVar4 = this->handler_;
      pcVar5 = (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      NVar13 = ReadNumericExpr(this,*pcVar5,true);
      NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnAlgebraicCon
                (pNVar4,iVar9,(NumericExpr)NVar13.super_ExprBase.impl_);
      break;
    case 0x46:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      type = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      if (SYMBOLIC < type) {
        local_68.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
        local_68.index_ = 0;
        local_68._12_4_ = 0;
        local_48.types_ = 0;
        local_48.field_1.values_ = (Value *)&local_68;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x4b971d,&local_48);
      }
      iVar10 = BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this->reader_);
      name = BinaryReader<mp::internal::EndiannessConverter>::ReadString(this->reader_);
      BasicExprFactory<std::allocator<char>_>::DefineFunction
                (&this->handler_->builder_->super_ExprFactory,iVar9,name,iVar10,type);
      break;
    case 0x47:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ObjHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                  *)this);
      break;
    case 0x4a:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                  *)this);
      break;
    case 0x4b:
      ReadColumnSizes<false>(this);
      break;
    case 0x4c:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.
                            num_logical_cons);
      pNVar4 = this->handler_;
      LVar12 = ReadLogicalExpr(this);
      BasicProblem<mp::BasicProblemParams<int>_>::MutLogicalCon::MutLogicalCon
                ((MutLogicalCon *)&local_68,pNVar4->builder_,iVar9);
      ((local_68.problem_)->logical_cons_).
      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
      ._M_impl.super__Vector_impl_data._M_start[local_68.index_].super_ExprBase.impl_ =
           (Impl *)LVar12.super_ExprBase.impl_;
      break;
    case 0x4f:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
      iVar10 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      pBVar14 = this->reader_;
      pcVar5 = (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      NVar13 = ReadNumericExpr(this,*pcVar5,true);
      pNVar4 = this->handler_;
      iVar11 = (*pNVar4->_vptr_NLProblemBuilder[3])(pNVar4);
      if (((char)iVar11 != '\0') ||
         (iVar11 = (*pNVar4->_vptr_NLProblemBuilder[2])(pNVar4), iVar11 + -1 == iVar9)) {
        pNVar4 = this->handler_;
        iVar11 = (*pNVar4->_vptr_NLProblemBuilder[3])(pNVar4);
        if ((char)iVar11 == '\0') {
          iVar9 = 0;
        }
        NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnObj
                  (pNVar4,iVar9,(uint)(iVar10 != 0),(NumericExpr)NVar13.super_ExprBase.impl_);
      }
      break;
    case 0x53:
      info = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(pBVar14);
      if (7 < (int)info) {
        local_68.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
        local_68.index_ = 0;
        local_68._12_4_ = 0;
        local_48.types_ = 0;
        local_48.field_1.values_ = (Value *)&local_68;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x4b9733,&local_48);
      }
      switch(info & 3) {
      case 0:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
        break;
      case 1:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
        break;
      case 2:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ObjHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
        break;
      case 3:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ProblemHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,info);
      }
      break;
    case 0x56:
      iVar9 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
                       this->num_vars_and_exprs_);
      iVar9 = iVar9 - (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      iVar10 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      iVar11 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      linear_expr = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
                    BeginCommonExpr(this->handler_,iVar9,iVar10);
      if (iVar10 != 0) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::ReadLinearExpr<mp::BasicProblem<mp::BasicProblemParams<int>>::LinearExprBuilder>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                    *)this,iVar10,(LinearExprBuilder)linear_expr.expr_);
      }
      pBVar14 = this->reader_;
      pNVar4 = this->handler_;
      pcVar5 = (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar14->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      NVar13 = ReadNumericExpr(this,*pcVar5,false);
      BasicProblem<mp::BasicProblemParams<int>_>::MutCommonExpr::MutCommonExpr
                ((MutCommonExpr *)&local_68,pNVar4->builder_,iVar9);
      ((local_68.problem_)->nonlinear_exprs_).
      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
      ._M_impl.super__Vector_impl_data._M_start[local_68.index_].super_ExprBase.impl_ =
           (Impl *)NVar13.super_ExprBase.impl_;
      BasicProblem<mp::BasicProblemParams<int>_>::MutCommonExpr::set_position
                ((MutCommonExpr *)&local_68,iVar11);
      break;
    default:
      if ((bVar1 == 0) &&
         ((byte *)(pBVar14->super_BinaryReaderBase).super_ReaderBase.end_ == pbVar3)) {
        if ((local_4c & 1) == 0) {
          return;
        }
        local_68.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
        local_68.index_ = 0;
        local_68._12_4_ = 0;
        local_48.types_ = 0;
        local_48.field_1.values_ = (Value *)&local_68;
        BinaryReaderBase::ReportError
                  (&pBVar14->super_BinaryReaderBase,(CStringRef)0x4b975d,&local_48);
        return;
      }
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x49:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
switchD_0045d47c_caseD_44:
      local_68.problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
      local_68.index_ = 0;
      local_68._12_4_ = 0;
      local_48.types_ = 0;
      local_48.field_1.values_ = (Value *)&local_68;
      BinaryReaderBase::ReportError(&pBVar14->super_BinaryReaderBase,(CStringRef)0x4b9771,&local_48)
      ;
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}